

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int blobReadWrite(sqlite3_blob *pBlob,void *z,int n,int iOffset,
                 _func_int_BtCursor_ptr_u32_u32_void_ptr *xCall)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  int *in_RDI;
  code *in_R8;
  sqlite3 *db;
  Vdbe *v;
  Incrblob *p;
  int rc;
  sqlite3 *db_00;
  sqlite3 *db_01;
  int local_4;
  
  if (in_RDI == (int *)0x0) {
    local_4 = sqlite3MisuseError(0);
  }
  else {
    db_00 = *(sqlite3 **)(in_RDI + 8);
    sqlite3_mutex_enter((sqlite3_mutex *)0x13909a);
    db_01 = *(sqlite3 **)(in_RDI + 6);
    if ((((-1 < in_EDX) && (-1 < in_ECX)) && ((long)in_ECX + (long)in_EDX <= (long)*in_RDI)) &&
       (db_01 != (sqlite3 *)0x0)) {
      sqlite3BtreeEnterCursor((BtCursor *)0x1390fd);
      iVar1 = (*in_R8)(*(undefined8 *)(in_RDI + 4),in_ECX + in_RDI[1],in_EDX,in_RSI);
      sqlite3BtreeLeaveCursor((BtCursor *)0x139134);
      if (iVar1 == 4) {
        sqlite3VdbeFinalize((Vdbe *)db_01);
        in_RDI[6] = 0;
        in_RDI[7] = 0;
      }
      else {
        *(int *)&db_01->lastRowid = iVar1;
      }
    }
    sqlite3Error(db_01,(int)((ulong)db_00 >> 0x20));
    local_4 = sqlite3ApiExit(db_00,0);
    sqlite3_mutex_leave((sqlite3_mutex *)0x13918f);
  }
  return local_4;
}

Assistant:

static int blobReadWrite(
  sqlite3_blob *pBlob, 
  void *z, 
  int n, 
  int iOffset, 
  int (*xCall)(BtCursor*, u32, u32, void*)
){
  int rc;
  Incrblob *p = (Incrblob *)pBlob;
  Vdbe *v;
  sqlite3 *db;

  if( p==0 ) return SQLITE_MISUSE_BKPT;
  db = p->db;
  sqlite3_mutex_enter(db->mutex);
  v = (Vdbe*)p->pStmt;

  if( n<0 || iOffset<0 || ((sqlite3_int64)iOffset+n)>p->nByte ){
    /* Request is out of range. Return a transient error. */
    rc = SQLITE_ERROR;
  }else if( v==0 ){
    /* If there is no statement handle, then the blob-handle has
    ** already been invalidated. Return SQLITE_ABORT in this case.
    */
    rc = SQLITE_ABORT;
  }else{
    /* Call either BtreeData() or BtreePutData(). If SQLITE_ABORT is
    ** returned, clean-up the statement handle.
    */
    assert( db == v->db );
    sqlite3BtreeEnterCursor(p->pCsr);

#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
    if( xCall==sqlite3BtreePutData && db->xPreUpdateCallback ){
      /* If a pre-update hook is registered and this is a write cursor, 
      ** invoke it here. 
      ** 
      ** TODO: The preupdate-hook is passed SQLITE_DELETE, even though this
      ** operation should really be an SQLITE_UPDATE. This is probably
      ** incorrect, but is convenient because at this point the new.* values 
      ** are not easily obtainable. And for the sessions module, an 
      ** SQLITE_UPDATE where the PK columns do not change is handled in the 
      ** same way as an SQLITE_DELETE (the SQLITE_DELETE code is actually
      ** slightly more efficient). Since you cannot write to a PK column
      ** using the incremental-blob API, this works. For the sessions module
      ** anyhow.
      */
      sqlite3_int64 iKey;
      iKey = sqlite3BtreeIntegerKey(p->pCsr);
      sqlite3VdbePreUpdateHook(
          v, v->apCsr[0], SQLITE_DELETE, p->zDb, p->pTab, iKey, -1
      );
    }
#endif

    rc = xCall(p->pCsr, iOffset+p->iOffset, n, z);
    sqlite3BtreeLeaveCursor(p->pCsr);
    if( rc==SQLITE_ABORT ){
      sqlite3VdbeFinalize(v);
      p->pStmt = 0;
    }else{
      v->rc = rc;
    }
  }
  sqlite3Error(db, rc);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}